

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_shaders.cpp
# Opt level: O0

void gen_phong_shade(float *cl,float *cp,float *l,float *e,float *n,int p,float *clambert)

{
  float *pfVar1;
  float fVar2;
  float local_54;
  float local_50;
  float local_4c [2];
  vec3 cphong;
  vec3 r;
  int p_local;
  float *n_local;
  float *e_local;
  float *l_local;
  float *cp_local;
  float *cl_local;
  
  fVar2 = vec3_mul_inner(l,n);
  vec3_scale(cphong + 1,n,fVar2 * 2.0);
  vec3_sub(cphong + 1,cphong + 1,l);
  vec3_norm(cphong + 1,cphong + 1);
  local_50 = 0.0;
  local_54 = vec3_mul_inner(e,cphong + 1);
  pfVar1 = std::max<float>(&local_50,&local_54);
  fVar2 = fast_pow(*pfVar1,p);
  vec3_scale(local_4c,cp,fVar2);
  vec3_fraction(local_4c,cl,local_4c);
  vec3_add(clambert,clambert,local_4c);
  vec3_cull(clambert);
  return;
}

Assistant:

void gen_phong_shade(const vec3 cl, const vec3 cp, const vec3 l, const vec3 e, const vec3 n, const int p, vec3 clambert){
    //calculate r
    vec3 r;
    vec3_scale( r, n, 2.0f*vec3_mul_inner(l,n) );
    vec3_sub(r, r, l);
    vec3_norm(r,r);

    //calculate shade
    vec3 cphong;
    vec3_scale(cphong, cp, fast_pow(std::max(0.0f,vec3_mul_inner(e,r)),p));
    vec3_fraction(cphong, cl, cphong);
    vec3_add(clambert, clambert, cphong);
    vec3_cull(clambert);
}